

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_sse2.c
# Opt level: O0

uint64_t aom_sum_sse_2d_i16_4x4_sse2(int16_t *src,int stride,int *sum)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int *in_RDX;
  int iVar5;
  ulong in_RSI;
  ulong uVar6;
  void *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  __m128i alVar9;
  __m128i a;
  __m128i v_sq_0123_d;
  __m128i v_sq_23_d;
  __m128i v_sq_01_d;
  __m128i v_sum_0123_d;
  __m128i v_val_23_w;
  __m128i v_val_01_w;
  __m128i v_val_2_w;
  __m128i v_val_0_w;
  __m128i one_reg;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined4 local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined2 local_a8;
  undefined2 uStack_a6;
  undefined2 uStack_a4;
  undefined2 uStack_a2;
  undefined2 uStack_a0;
  undefined2 uStack_9e;
  undefined2 uStack_9c;
  undefined2 uStack_9a;
  undefined2 local_98;
  undefined2 uStack_96;
  undefined2 uStack_94;
  undefined2 uStack_92;
  undefined2 uStack_90;
  undefined2 uStack_8e;
  undefined2 uStack_8c;
  undefined2 uStack_8a;
  
  iVar5 = (int)in_RSI;
  uVar6 = in_RSI;
  xx_loadl_64(in_RDI);
  alVar9 = xx_loadl_64((void *)((long)in_RDI + (long)(iVar5 * 2) * 2));
  a[1] = uVar6;
  a[0] = (longlong)((long)in_RDI + (long)iVar5 * 2);
  xx_loadh_64(a,alVar9[1]);
  alVar9[1] = uVar6;
  alVar9[0] = (longlong)((long)in_RDI + (long)(iVar5 * 3) * 2);
  xx_loadh_64(alVar9,(void *)(in_RSI & 0xffffffff));
  local_98 = (short)extraout_XMM0_Qa;
  uStack_96 = (short)((ulong)extraout_XMM0_Qa >> 0x10);
  uStack_94 = (short)((ulong)extraout_XMM0_Qa >> 0x20);
  uStack_92 = (short)((ulong)extraout_XMM0_Qa >> 0x30);
  uStack_90 = (short)extraout_XMM0_Qb;
  uStack_8e = (short)((ulong)extraout_XMM0_Qb >> 0x10);
  uStack_8c = (short)((ulong)extraout_XMM0_Qb >> 0x20);
  uStack_8a = (short)((ulong)extraout_XMM0_Qb >> 0x30);
  local_a8 = (short)extraout_XMM0_Qa_00;
  uStack_a6 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x10);
  uStack_a4 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x20);
  uStack_a2 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x30);
  uStack_a0 = (short)extraout_XMM0_Qb_00;
  uStack_9e = (short)((ulong)extraout_XMM0_Qb_00 >> 0x10);
  uStack_9c = (short)((ulong)extraout_XMM0_Qb_00 >> 0x20);
  uStack_9a = (short)((ulong)extraout_XMM0_Qb_00 >> 0x30);
  local_218._0_4_ = CONCAT22(uStack_96 + uStack_a6,local_98 + local_a8);
  local_218._0_6_ = CONCAT24(uStack_94 + uStack_a4,(undefined4)local_218);
  local_218 = CONCAT26(uStack_92 + uStack_a2,(undefined6)local_218);
  uStack_210._0_2_ = uStack_90 + uStack_a0;
  uStack_210._2_2_ = uStack_8e + uStack_9e;
  uStack_210._4_2_ = uStack_8c + uStack_9c;
  uStack_210._6_2_ = uStack_8a + uStack_9a;
  auVar4._8_8_ = uStack_210;
  auVar4._0_8_ = local_218;
  auVar3._8_8_ = 0x1000100010001;
  auVar3._0_8_ = 0x1000100010001;
  auVar7 = pmaddwd(auVar4,auVar3);
  local_108 = auVar7._0_4_;
  uStack_104 = auVar7._4_4_;
  uStack_100 = auVar7._8_4_;
  uStack_fc = auVar7._12_4_;
  *in_RDX = local_108 + uStack_100 + uStack_104 + uStack_fc;
  auVar2._8_8_ = extraout_XMM0_Qb;
  auVar2._0_8_ = extraout_XMM0_Qa;
  auVar8._8_8_ = extraout_XMM0_Qb;
  auVar8._0_8_ = extraout_XMM0_Qa;
  auVar8 = pmaddwd(auVar2,auVar8);
  auVar1._8_8_ = extraout_XMM0_Qb_00;
  auVar1._0_8_ = extraout_XMM0_Qa_00;
  auVar7._8_8_ = extraout_XMM0_Qb_00;
  auVar7._0_8_ = extraout_XMM0_Qa_00;
  auVar7 = pmaddwd(auVar1,auVar7);
  local_148 = auVar8._0_4_;
  uStack_144 = auVar8._4_4_;
  uStack_140 = auVar8._8_4_;
  uStack_13c = auVar8._12_4_;
  local_158 = auVar7._0_4_;
  uStack_154 = auVar7._4_4_;
  uStack_150 = auVar7._8_4_;
  uStack_14c = auVar7._12_4_;
  return (long)(local_148 + local_158 + uStack_140 + uStack_150 +
               uStack_144 + uStack_154 + uStack_13c + uStack_14c);
}

Assistant:

uint64_t aom_sum_sse_2d_i16_4x4_sse2(const int16_t *src, int stride, int *sum) {
  const __m128i one_reg = _mm_set1_epi16(1);
  const __m128i v_val_0_w = xx_loadl_64(src + 0 * stride);
  const __m128i v_val_2_w = xx_loadl_64(src + 2 * stride);
  __m128i v_val_01_w = xx_loadh_64(v_val_0_w, src + 1 * stride);
  __m128i v_val_23_w = xx_loadh_64(v_val_2_w, src + 3 * stride);

  __m128i v_sum_0123_d = _mm_add_epi16(v_val_01_w, v_val_23_w);
  v_sum_0123_d = _mm_madd_epi16(v_sum_0123_d, one_reg);
  v_sum_0123_d = _mm_add_epi32(v_sum_0123_d, _mm_srli_si128(v_sum_0123_d, 8));
  v_sum_0123_d = _mm_add_epi32(v_sum_0123_d, _mm_srli_si128(v_sum_0123_d, 4));
  *sum = _mm_cvtsi128_si32(v_sum_0123_d);

  const __m128i v_sq_01_d = _mm_madd_epi16(v_val_01_w, v_val_01_w);
  const __m128i v_sq_23_d = _mm_madd_epi16(v_val_23_w, v_val_23_w);
  __m128i v_sq_0123_d = _mm_add_epi32(v_sq_01_d, v_sq_23_d);
  v_sq_0123_d = _mm_add_epi32(v_sq_0123_d, _mm_srli_si128(v_sq_0123_d, 8));
  v_sq_0123_d = _mm_add_epi32(v_sq_0123_d, _mm_srli_si128(v_sq_0123_d, 4));
  return (uint64_t)_mm_cvtsi128_si32(v_sq_0123_d);
}